

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O1

void __thiscall jhu::thrax::TreeTests_Small_Test::TestBody(TreeTests_Small_Test *this)

{
  bool bVar1;
  char *message;
  string_view line;
  AssertionResult gtest_ar;
  Tree t;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  Tree local_20;
  
  line._M_str = "(ROOT (A foo) (B bar))";
  line._M_len = 0x16;
  readTree(&local_20,line);
  local_38.data_._0_4_ = 3;
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
              _M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_30,"3","t.size()",(int *)&local_38,(unsigned_long *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0x21,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
      local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    anon_unknown_10::expectNode
              (0,2,"ROOT",(Node *)0x0,
               *local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                _M_impl.super__Vector_impl_data._M_start);
    anon_unknown_10::expectNode
              (0,1,"A",local_20.
                       super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                       _M_impl.super__Vector_impl_data._M_start,
               local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
               _M_impl.super__Vector_impl_data._M_start[1]);
    anon_unknown_10::expectNode
              (1,2,"B",local_20.
                       super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                       _M_impl.super__Vector_impl_data._M_start,
               local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
               _M_impl.super__Vector_impl_data._M_start[2]);
  }
  if (local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (Node *)0x0) {
    operator_delete(local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TreeTests, Small) {
  auto t = readTree("(ROOT (A foo) (B bar))");
  ASSERT_EQ(3, t.size());
  expectNode(0, 2, "ROOT", nullptr, t[0]);
  expectNode(0, 1, "A", &t[0], t[1]);
  expectNode(1, 2, "B", &t[0], t[2]);
}